

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::push_back
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,
          pair<void_*,_unsigned_long> *Elt)

{
  size_t sVar1;
  size_t sVar2;
  iterator ppVar3;
  pair<void_*,_unsigned_long> *Elt_local;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    grow(this,0);
  }
  ppVar3 = SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>::end
                     (&this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>
                     );
  ppVar3->first = Elt->first;
  ppVar3->second = Elt->second;
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }